

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool embree::operator==(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                        *a,vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                           *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  Vec3fa *pVVar6;
  ulong local_a0;
  bool local_81;
  size_t i;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *b_local;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *a_local;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  if (a->size_active == b->size_active) {
    for (local_a0 = 0; local_a0 < a->size_active; local_a0 = local_a0 + 1) {
      pVVar6 = b->items + local_a0;
      uVar1 = *(undefined8 *)&a->items[local_a0].field_0;
      uVar2 = *(undefined8 *)((long)&a->items[local_a0].field_0 + 8);
      uVar3 = *(undefined8 *)((long)&pVVar6->field_0 + 8);
      local_18 = (float)uVar1;
      fStack_14 = (float)((ulong)uVar1 >> 0x20);
      fStack_10 = (float)uVar2;
      fStack_c = (float)((ulong)uVar2 >> 0x20);
      local_28 = (float)*(undefined8 *)&pVVar6->field_0;
      fStack_24 = (float)((ulong)*(undefined8 *)&pVVar6->field_0 >> 0x20);
      fStack_20 = (float)uVar3;
      fStack_1c = (float)((ulong)uVar3 >> 0x20);
      auVar4._4_4_ = -(uint)(fStack_14 != fStack_24);
      auVar4._0_4_ = -(uint)(local_18 != local_28);
      auVar4._8_4_ = -(uint)(fStack_10 != fStack_20);
      auVar4._12_4_ = -(uint)(fStack_c != fStack_1c);
      uVar5 = movmskps((int)pVVar6,auVar4);
      if ((uVar5 & 7) != 0) {
        return false;
      }
    }
    local_81 = true;
  }
  else {
    local_81 = false;
  }
  return local_81;
}

Assistant:

bool operator== (const vector_t& a, const vector_t& b) 
    {
      if (a.size() != b.size()) return false;
      for (size_t i=0; i<a.size(); i++)
        if (a[i] != b[i])
          return false;
      return true;
    }